

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_282016::PeerManagerImpl::RelayAddress
          (PeerManagerImpl *this,NodeId originator,CAddress *addr,bool fReachable)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  size_t data;
  time_point tVar4;
  CSipHasher *pCVar5;
  uint64_t uVar6;
  _Base_ptr p_Var7;
  undefined7 in_register_00000009;
  ulong uVar8;
  long lVar9;
  undefined8 *puVar10;
  int iVar11;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock50;
  CSipHasher hasher;
  unique_lock<std::mutex> local_c8;
  ulong local_b8 [4];
  CSipHasher local_98;
  CSipHasher local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((int)CONCAT71(in_register_00000009,fReachable) != 0) ||
     ((addr->super_CService).super_CNetAddr.m_net - NET_IPV4 < 5)) {
    local_68.v[0] = 0;
    local_68.v[1] = 0;
    data = CServiceHash::operator()((CServiceHash *)&local_68,&addr->super_CService);
    tVar4 = NodeClock::now();
    CConnman::GetDeterministicRandomizer(&local_98,this->m_connman,0x3cac0035b5866b90);
    pCVar5 = CSipHasher::Write(&local_98,data);
    pCVar5 = CSipHasher::Write(pCVar5,((long)tVar4.__d.__r / 1000000000 + data) / 0x15180);
    local_68.v[0] = pCVar5->v[0];
    local_68.v[1] = pCVar5->v[1];
    local_68.v[2] = pCVar5->v[2];
    local_68.v[3]._0_1_ = (undefined1)pCVar5->v[3];
    local_68.v[3]._1_7_ = (undefined7)(pCVar5->v[3] >> 8);
    local_68.tmp._0_1_ = (undefined1)pCVar5->tmp;
    local_68.tmp._1_7_ = (undefined7)(pCVar5->tmp >> 8);
    local_68.count = (uint8_t)*(undefined8 *)&pCVar5->count;
    local_68._41_7_ = SUB87((ulong)*(undefined8 *)&pCVar5->count >> 8,0);
    iVar11 = 2;
    if (!fReachable) {
      uVar6 = CSipHasher::Finalize(&local_68);
      iVar11 = ((uint)uVar6 & 1) + 1;
    }
    local_b8[2] = 0;
    local_b8[3] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_c8._M_device = &(this->m_peer_mutex).super_mutex;
    local_c8._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_c8);
    p_Var7 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      do {
        if (((((ulong)p_Var7[1]._M_parent[8]._M_right & 1) != 0) &&
            (*(long *)(p_Var7 + 1) != originator)) &&
           ((((ulong)p_Var7[1]._M_parent[10]._M_right & 1) != 0 ||
            (bVar3 = CNetAddr::IsAddrV1Compatible((CNetAddr *)addr), bVar3)))) {
          local_98.count = local_68.count;
          local_98.tmp._1_7_ = local_68.tmp._1_7_;
          local_98.tmp._0_1_ = (undefined1)local_68.tmp;
          local_98.v[2] = local_68.v[2];
          local_98.v[3]._0_1_ = (undefined1)local_68.v[3];
          local_98.v[3]._1_7_ = local_68.v[3]._1_7_;
          local_98.v[0] = local_68.v[0];
          local_98.v[1] = local_68.v[1];
          pCVar5 = CSipHasher::Write(&local_98,*(uint64_t *)(p_Var7 + 1));
          uVar6 = CSipHasher::Finalize(pCVar5);
          uVar8 = 0;
LAB_001db6f1:
          if (uVar6 <= *(ulong *)((long)local_b8 + uVar8)) goto code_r0x001db6f8;
          lVar9 = (long)(((ulong)(uint)(iVar11 << 4) - 0x10) - uVar8) >> 4;
          if (0 < lVar9) {
            puVar10 = (undefined8 *)((long)local_b8 + uVar8);
            lVar9 = lVar9 + 1;
            do {
              puVar10[2] = *puVar10;
              puVar10[3] = puVar10[1];
              puVar10 = puVar10 + 2;
              lVar9 = lVar9 + -1;
            } while (1 < lVar9);
          }
          p_Var2 = p_Var7[1]._M_parent;
          *(uint64_t *)((long)local_b8 + uVar8) = uVar6;
          *(_Base_ptr *)((long)local_b8 + uVar8 + 8) = p_Var2;
        }
LAB_001db740:
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    }
    uVar8 = 0;
    do {
      if (*(long *)((long)local_b8 + uVar8) == 0) break;
      PushAddress(this,*(Peer **)((long)local_b8 + uVar8 + 8),addr);
      uVar8 = uVar8 + 0x10;
    } while ((uint)(iVar11 << 4) != uVar8);
    std::unique_lock<std::mutex>::~unique_lock(&local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
code_r0x001db6f8:
  uVar8 = uVar8 + 0x10;
  if ((uint)(iVar11 << 4) == uVar8) goto LAB_001db740;
  goto LAB_001db6f1;
}

Assistant:

void PeerManagerImpl::RelayAddress(NodeId originator,
                                   const CAddress& addr,
                                   bool fReachable)
{
    // We choose the same nodes within a given 24h window (if the list of connected
    // nodes does not change) and we don't relay to nodes that already know an
    // address. So within 24h we will likely relay a given address once. This is to
    // prevent a peer from unjustly giving their address better propagation by sending
    // it to us repeatedly.

    if (!fReachable && !addr.IsRelayable()) return;

    // Relay to a limited number of other nodes
    // Use deterministic randomness to send to the same nodes for 24 hours
    // at a time so the m_addr_knowns of the chosen nodes prevent repeats
    const uint64_t hash_addr{CServiceHash(0, 0)(addr)};
    const auto current_time{GetTime<std::chrono::seconds>()};
    // Adding address hash makes exact rotation time different per address, while preserving periodicity.
    const uint64_t time_addr{(static_cast<uint64_t>(count_seconds(current_time)) + hash_addr) / count_seconds(ROTATE_ADDR_RELAY_DEST_INTERVAL)};
    const CSipHasher hasher{m_connman.GetDeterministicRandomizer(RANDOMIZER_ID_ADDRESS_RELAY)
                                .Write(hash_addr)
                                .Write(time_addr)};

    // Relay reachable addresses to 2 peers. Unreachable addresses are relayed randomly to 1 or 2 peers.
    unsigned int nRelayNodes = (fReachable || (hasher.Finalize() & 1)) ? 2 : 1;

    std::array<std::pair<uint64_t, Peer*>, 2> best{{{0, nullptr}, {0, nullptr}}};
    assert(nRelayNodes <= best.size());

    LOCK(m_peer_mutex);

    for (auto& [id, peer] : m_peer_map) {
        if (peer->m_addr_relay_enabled && id != originator && IsAddrCompatible(*peer, addr)) {
            uint64_t hashKey = CSipHasher(hasher).Write(id).Finalize();
            for (unsigned int i = 0; i < nRelayNodes; i++) {
                 if (hashKey > best[i].first) {
                     std::copy(best.begin() + i, best.begin() + nRelayNodes - 1, best.begin() + i + 1);
                     best[i] = std::make_pair(hashKey, peer.get());
                     break;
                 }
            }
        }
    };

    for (unsigned int i = 0; i < nRelayNodes && best[i].first != 0; i++) {
        PushAddress(*best[i].second, addr);
    }
}